

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# process.hpp
# Opt level: O3

ssize_t __thiscall procxx::pipe_t::write(pipe_t *this,int __fd,void *__buf,size_t __n)

{
  ssize_t sVar1;
  int *piVar2;
  exception *this_00;
  size_t __n_00;
  undefined4 in_register_00000034;
  char *__buf_00;
  void *__buf_01;
  
  __buf_01 = (void *)CONCAT44(in_register_00000034,__fd);
  while( true ) {
    while (sVar1 = ::write((this->pipe_)._M_elems[1],__buf_01,(size_t)__buf), sVar1 == -1) {
      piVar2 = __errno_location();
      if (*piVar2 != 4) {
        perror("pipe_t::write()");
        this_00 = (exception *)__cxa_allocate_exception(0x10);
        __buf_00 = "failed to write";
        exception::runtime_error(this_00,"failed to write");
        sVar1 = write((int)this_00,__buf_00,__n_00);
        return sVar1;
      }
    }
    if ((void *)((long)__buf - sVar1) == (void *)0x0 || (long)__buf < sVar1) break;
    __buf_01 = (void *)((long)__buf_01 + sVar1);
    __buf = (void *)((long)__buf - sVar1);
  }
  return sVar1;
}

Assistant:

void write(const char* buf, uint64_t length) {
    auto bytes = ::write(pipe_[WRITE_END], buf, length);
    if (bytes == -1) {
      // interrupt, just attempt to write again
      if (errno == EINTR)
        return write(buf, length);
      // otherwise, unrecoverable error
      perror("pipe_t::write()");
      throw exception{"failed to write"};
    }
    if (bytes < static_cast<ssize_t>(length))
      write(buf + bytes, length - static_cast<uint64_t>(bytes));
  }